

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_2x2.h
# Opt level: O0

void ncnn::pooling2x2s2_max_avx(Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 (*pauVar5) [32];
  undefined1 (*pauVar6) [16];
  float *pfVar7;
  long in_RSI;
  long in_RDI;
  undefined1 auVar8 [32];
  float max1;
  float max0;
  __m128 _max;
  __m128 _max_1;
  __m128 _max_0;
  __m256 _max_r0_r1;
  __m256 _r1;
  __m256 _r0;
  int remain;
  int nn;
  int i;
  __m256i permute_mask;
  float *r1;
  float *r0;
  int outcount;
  float *outptr;
  float *img0;
  int q;
  int tailstep;
  int outh;
  int outw;
  int inch;
  int w;
  float local_398;
  float in_stack_fffffffffffffc6c;
  Mat *this;
  undefined1 local_390 [16];
  undefined8 uStack_388;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 (*local_2a8) [32];
  undefined1 (*local_2a0) [32];
  Mat local_290;
  undefined1 (*local_248) [16];
  Mat local_230;
  undefined1 (*local_1e8) [32];
  int local_1e0;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  undefined1 (*local_1b0) [32];
  undefined1 (*local_1a8) [32];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined1 (*local_128) [16];
  undefined4 local_120;
  undefined4 local_11c;
  undefined4 local_118;
  undefined4 local_114;
  undefined4 local_110;
  undefined4 local_10c;
  undefined4 local_108;
  undefined4 local_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [16];
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 uStack_88;
  undefined1 local_80 [32];
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  local_1cc = *(int *)(in_RDI + 0x2c);
  local_1d0 = *(int *)(in_RDI + 0x38);
  local_1d4 = *(int *)(in_RSI + 0x2c);
  local_1d8 = *(int *)(in_RSI + 0x30);
  local_1dc = local_1cc * 2 + local_1d4 * -2;
  for (local_1e0 = 0; local_1e0 < local_1d0; local_1e0 = local_1e0 + 1) {
    Mat::channel(this,(int)in_stack_fffffffffffffc6c);
    pauVar5 = (undefined1 (*) [32])Mat::operator_cast_to_float_(&local_230);
    Mat::~Mat((Mat *)0x4b6a60);
    local_1e8 = pauVar5;
    Mat::channel(this,(int)in_stack_fffffffffffffc6c);
    pauVar6 = (undefined1 (*) [16])Mat::operator_cast_to_float_(&local_290);
    Mat::~Mat((Mat *)0x4b6aac);
    local_2a0 = local_1e8;
    local_2a8 = (undefined1 (*) [32])(*local_1e8 + (long)local_1cc * 4);
    local_104 = 0;
    local_108 = 2;
    local_10c = 4;
    local_110 = 6;
    local_114 = 1;
    local_118 = 3;
    local_11c = 5;
    local_120 = 7;
    local_34 = 7;
    local_38 = 5;
    local_3c = 3;
    local_40 = 1;
    local_44 = 6;
    local_48 = 4;
    local_4c = 2;
    local_50 = 0;
    auVar2 = vpinsrd_avx(ZEXT416(1),3,1);
    auVar2 = vpinsrd_avx(auVar2,5,2);
    auVar2 = vpinsrd_avx(auVar2,7,3);
    auVar3 = vpinsrd_avx(ZEXT416(0),2,1);
    auVar3 = vpinsrd_avx(auVar3,4,2);
    auVar3 = vpinsrd_avx(auVar3,6,3);
    auVar8._0_16_ = ZEXT116(0) * auVar2 + ZEXT116(1) * auVar3;
    auVar8._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar2;
    local_248 = pauVar6;
    local_80 = auVar8;
    for (local_2e4 = 0; local_2e4 < local_1d8; local_2e4 = local_2e4 + 1) {
      local_2e8 = local_1d4 >> 2;
      local_2ec = local_1d4 + local_2e8 * -4;
      for (; 0 < local_2e8; local_2e8 = local_2e8 + -1) {
        local_1a8 = local_2a0;
        local_180 = *(undefined8 *)*local_2a0;
        uStack_178 = *(undefined8 *)(*local_2a0 + 8);
        uStack_170 = *(undefined8 *)(*local_2a0 + 0x10);
        uStack_168 = *(undefined8 *)(*local_2a0 + 0x18);
        local_1b0 = local_2a8;
        local_1a0 = *(undefined8 *)*local_2a8;
        uStack_198 = *(undefined8 *)(*local_2a8 + 8);
        uStack_190 = *(undefined8 *)(*local_2a8 + 0x10);
        uStack_188 = *(undefined8 *)(*local_2a8 + 0x18);
        auVar1 = vmaxps_avx(*local_2a0,*local_2a8);
        local_360 = auVar1._0_8_;
        local_a0 = local_360;
        uStack_358 = auVar1._8_8_;
        uStack_98 = uStack_358;
        uStack_350 = auVar1._16_8_;
        uStack_90 = uStack_350;
        uStack_348 = auVar1._24_8_;
        uStack_88 = uStack_348;
        local_c0 = local_360;
        uStack_b8 = uStack_358;
        uStack_b0 = uStack_350;
        uStack_a8 = uStack_348;
        uStack_2d0 = auVar8._16_8_;
        uStack_d0 = uStack_2d0;
        uStack_2c8 = auVar8._24_8_;
        uStack_c8 = uStack_2c8;
        auVar4._16_8_ = uStack_2d0;
        auVar4._0_16_ = auVar8._0_16_;
        auVar4._24_8_ = uStack_2c8;
        local_100 = vpermd_avx2(auVar4,auVar1);
        uStack_358 = local_100._8_8_;
        uStack_350 = local_100._16_8_;
        local_150 = local_100._0_8_;
        uStack_148 = uStack_358;
        local_160 = uStack_350;
        uStack_158 = local_100._24_8_;
        local_390 = vmaxps_avx(local_100._0_16_,local_100._16_16_);
        local_128 = local_248;
        uStack_138 = uStack_388;
        *local_248 = local_390;
        local_2a0 = local_2a0 + 1;
        local_2a8 = local_2a8 + 1;
        local_248 = local_248 + 1;
        local_140 = this;
        local_e0 = auVar8._0_16_;
      }
      for (; 0 < local_2ec; local_2ec = local_2ec + -1) {
        pfVar7 = std::max<float>((float *)local_2a0,(float *)(*local_2a0 + 4));
        in_stack_fffffffffffffc6c = *pfVar7;
        pfVar7 = std::max<float>((float *)local_2a8,(float *)(*local_2a8 + 4));
        local_398 = *pfVar7;
        pfVar7 = std::max<float>((float *)&stack0xfffffffffffffc6c,&local_398);
        *(float *)*local_248 = *pfVar7;
        local_2a0 = (undefined1 (*) [32])(*local_2a0 + 8);
        local_2a8 = (undefined1 (*) [32])(*local_2a8 + 8);
        local_248 = (undefined1 (*) [16])(*local_248 + 4);
      }
      local_2a0 = (undefined1 (*) [32])(*local_2a0 + (long)local_1dc * 4);
      local_2a8 = (undefined1 (*) [32])(*local_2a8 + (long)local_1dc * 4);
    }
  }
  return;
}

Assistant:

static void pooling2x2s2_max_avx(const Mat& bottom_blob, Mat& top_blob,
                                 const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;

    const int tailstep = w - 2 * outw + w;
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < inch; q++)
    {
        const float* img0 = bottom_blob.channel(q);
        float* outptr = top_blob.channel(q);
        int outcount = 0;
        const float* r0 = img0;
        const float* r1 = img0 + w;
#if __AVX2__
        __m256i permute_mask = _mm256_setr_epi32(0, 2, 4, 6, 1, 3, 5, 7);
#endif // __AVX__

        for (int i = 0; i < outh; i++)
        {
#if __AVX2__
            int nn = outw >> 2;
            int remain = outw - (nn << 2);
#else
            int remain = outw;
#endif // __AVX__

#if __AVX2__
            for (; nn > 0; nn--)
            {
                __m256 _r0 = _mm256_loadu_ps(r0);
                __m256 _r1 = _mm256_loadu_ps(r1);
                __m256 _max_r0_r1 = _mm256_max_ps(_r0, _r1);
                _max_r0_r1 = _mm256_castsi256_ps(_mm256_permutevar8x32_epi32(
                                                     _mm256_castps_si256(_max_r0_r1), permute_mask));
                __m128 _max_0 = _mm256_extractf128_ps(_max_r0_r1, 0);
                __m128 _max_1 = _mm256_extractf128_ps(_max_r0_r1, 1);
                __m128 _max = _mm_max_ps(_max_0, _max_1);
                _mm_storeu_ps(outptr, _max);
                r0 += 8;
                r1 += 8;
                outptr += 4;
                outcount += 4;
            }
#endif // __AVX__
            for (; remain > 0; remain--)
            {
                float max0 = std::max(r0[0], r0[1]);
                float max1 = std::max(r1[0], r1[1]);

                *outptr = std::max(max0, max1);

                r0 += 2;
                r1 += 2;
                outptr++;
                outcount++;
            }
            r0 += tailstep;
            r1 += tailstep;
        }
    }
}